

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setVolumeMeshToInspect(SlicePlane *this,string *meshname)

{
  string *psVar1;
  VolumeMesh *pVVar2;
  string sStack_68;
  string local_48;
  
  psVar1 = &this->inspectedMeshName;
  std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  pVVar2 = getVolumeMesh(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (pVVar2 != (VolumeMesh *)0x0) {
    VolumeMesh::removeSlicePlaneListener(pVVar2,this);
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::string((string *)&sStack_68,(string *)psVar1);
  pVVar2 = getVolumeMesh(&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  if (pVVar2 == (VolumeMesh *)0x0) {
    std::__cxx11::string::assign((char *)psVar1);
  }
  else {
    PersistentValue<bool>::set(&this->drawPlane,false);
    VolumeMesh::addSlicePlaneListener(pVVar2,this);
    Structure::setCullWholeElements((Structure *)pVVar2,false);
    VolumeMesh::ensureHaveTets(pVVar2);
  }
  this->shouldInspectMesh = pVVar2 != (VolumeMesh *)0x0;
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->volumeInspectProgram).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void SlicePlane::setVolumeMeshToInspect(std::string meshname) {
  VolumeMesh* oldMeshToInspect = polyscope::getVolumeMesh(inspectedMeshName);
  if (oldMeshToInspect != nullptr) {
    oldMeshToInspect->removeSlicePlaneListener(this);
  }
  inspectedMeshName = meshname;
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);
  if (meshToInspect == nullptr) {
    inspectedMeshName = "";
    shouldInspectMesh = false;
    volumeInspectProgram.reset();
    return;
  }
  drawPlane = false;
  meshToInspect->addSlicePlaneListener(this);
  meshToInspect->setCullWholeElements(false);
  meshToInspect->ensureHaveTets(); // do this as early as possible because it is expensive
  shouldInspectMesh = true;
  volumeInspectProgram.reset();
}